

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepImageChannel.h
# Opt level: O2

void __thiscall
Imf_2_5::TypedDeepImageChannel<half>::initializeSampleLists(TypedDeepImageChannel<half> *this)

{
  uint uVar1;
  uint *puVar2;
  size_t *psVar3;
  half **pphVar4;
  SampleCountChannel *pSVar5;
  half *phVar6;
  size_t i;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  
  if (this->_sampleBuffer != (half *)0x0) {
    operator_delete__(this->_sampleBuffer);
  }
  this->_sampleBuffer = (half *)0x0;
  pSVar5 = DeepImageChannel::sampleCounts(&this->super_DeepImageChannel);
  puVar2 = pSVar5->_numSamples;
  pSVar5 = DeepImageChannel::sampleCounts(&this->super_DeepImageChannel);
  psVar3 = pSVar5->_sampleListPositions;
  pSVar5 = DeepImageChannel::sampleCounts(&this->super_DeepImageChannel);
  uVar8 = 0xffffffffffffffff;
  if (-1 < (long)pSVar5->_sampleBufferSize) {
    uVar8 = pSVar5->_sampleBufferSize * 2;
  }
  phVar6 = (half *)operator_new__(uVar8);
  this->_sampleBuffer = phVar6;
  (*(this->super_DeepImageChannel).super_ImageChannel._vptr_ImageChannel[9])();
  uVar8 = (this->super_DeepImageChannel).super_ImageChannel._numPixels;
  for (uVar7 = 0; uVar7 < uVar8; uVar7 = uVar7 + 1) {
    this->_sampleListPointers[uVar7] = this->_sampleBuffer + psVar3[uVar7];
    uVar1 = puVar2[uVar7];
    pphVar4 = this->_sampleListPointers;
    for (uVar9 = 0; uVar9 < uVar1; uVar9 = uVar9 + 1) {
      pphVar4[uVar7][uVar9]._h = 0;
    }
  }
  return;
}

Assistant:

void
TypedDeepImageChannel<T>::initializeSampleLists ()
{
    //
    // Allocate a new set of sample lists for this channel, and
    // construct zero-filled sample lists for the pixels.
    //

    delete [] _sampleBuffer;

    _sampleBuffer = 0;          // set to 0 to prevent double deletion
                                // in case of an exception

    const unsigned int * numSamples = sampleCounts().numSamples();
    const size_t * sampleListPositions = sampleCounts().sampleListPositions();

    _sampleBuffer = new T [sampleCounts().sampleBufferSize()];
    
    resetBasePointer();

    for (size_t i = 0; i < numPixels(); ++i)
    {
        _sampleListPointers[i] = _sampleBuffer + sampleListPositions[i];

        for (unsigned int j = 0; j < numSamples[i]; ++j)
            _sampleListPointers[i][j] = T (0);
    }
}